

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_font.cpp
# Opt level: O2

void Timidity::font_add(char *filename,int load_order)

{
  FontFile *pFVar1;
  FileReader *f;
  SFFile *pSVar2;
  
  pFVar1 = font_find(filename);
  if (pFVar1 != (FontFile *)0x0) {
    (*pFVar1->_vptr_FontFile[5])(pFVar1,load_order);
    return;
  }
  f = PathExpander::openFileReader((PathExpander *)pathExpander,filename,(int *)0x0);
  if (f != (FileReader *)0x0) {
    pSVar2 = ReadSF2(filename,f);
    if (pSVar2 != (SFFile *)0x0) {
      (*(pSVar2->super_FontFile)._vptr_FontFile[5])(pSVar2,load_order);
    }
    (*(f->super_FileReaderBase)._vptr_FileReaderBase[1])(f);
    return;
  }
  return;
}

Assistant:

void font_add(const char *filename, int load_order)
{
	FontFile *font;

	font = font_find(filename);
	if (font != NULL)
	{
		font->SetAllOrders(load_order);
	}
	else
	{
		FileReader *fp = pathExpander.openFileReader(filename, NULL);

		if (fp != NULL)
		{
			if ((font = ReadSF2(filename, fp)) || (font = ReadDLS(filename, fp)))
			{
				font->SetAllOrders(load_order);
			}
			delete fp;
		}
	}
}